

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O1

void __thiscall cmCTestSVN::WriteXMLGlobal(cmCTestSVN *this,cmXMLWriter *xml)

{
  SVNInfo *pSVar1;
  string local_40;
  
  cmCTestGlobalVC::WriteXMLGlobal(&this->super_cmCTestGlobalVC,xml);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SVNPath","");
  pSVar1 = this->RootInfo;
  cmXMLWriter::StartElement(xml,&local_40);
  cmXMLWriter::Content<std::__cxx11::string>(xml,&pSVar1->Base);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestSVN::WriteXMLGlobal(cmXMLWriter& xml)
{
  this->cmCTestGlobalVC::WriteXMLGlobal(xml);

  xml.Element("SVNPath", this->RootInfo->Base);
}